

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O3

bool __thiscall cmValue::IsNOTFOUND(cmValue *this,string_view value)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = (char *)value._M_len;
  if (this == (cmValue *)0x8) {
    if (*(long *)local_10._M_str == 0x444e554f46544f4e) {
      return true;
    }
  }
  else if ((cmValue *)0x8 < this) {
    __str._M_str = "-NOTFOUND";
    __str._M_len = 9;
    local_10._M_len = (size_t)this;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_10,(size_type)((long)&this[-2].Value + 7),9,__str);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool cmValue::IsNOTFOUND(cm::string_view value) noexcept
{
  return (value == "NOTFOUND"_s) || cmHasSuffix(value, "-NOTFOUND"_s);
}